

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

tuple<long,_double,_double> * __thiscall
fasttext::FastText::test(FastText *this,istream *in,int32_t k,real threshold)

{
  unsigned_long *__elements;
  Meter *in_RDX;
  undefined8 in_RSI;
  Meter *in_RDI;
  Meter *pMVar1;
  double *__elements_2;
  FastText *unaff_retaddr;
  Meter meter;
  undefined8 in_stack_ffffffffffffff18;
  Meter *this_00;
  Meter local_98;
  
  this_00 = in_RDI;
  pMVar1 = in_RDI;
  Meter::Meter(in_RDI,SUB81((ulong)in_stack_ffffffffffffff18 >> 0x38,0));
  test(unaff_retaddr,(istream *)pMVar1,(int32_t)((ulong)in_RSI >> 0x20),(real)in_RSI,in_RDX);
  __elements = (unsigned_long *)Meter::nexamples(&local_98);
  pMVar1 = (Meter *)Meter::precision((Meter *)0x1b65c8);
  __elements_2 = (double *)Meter::recall((Meter *)0x1b65e6);
  std::tuple<long,_double,_double>::tuple<unsigned_long,_double,_double,_true,_true>
            ((tuple<long,_double,_double> *)this_00,__elements,(double *)pMVar1,__elements_2);
  Meter::~Meter(pMVar1);
  return (tuple<long,_double,_double> *)in_RDI;
}

Assistant:

std::tuple<int64_t, double, double>
FastText::test(std::istream& in, int32_t k, real threshold) {
  Meter meter(false);
  test(in, k, threshold, meter);

  return std::tuple<int64_t, double, double>(
      meter.nexamples(), meter.precision(), meter.recall());
}